

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Add_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  JavascriptString *pJVar7;
  JavascriptString *pstRight;
  int64 iVar8;
  int64 iVar9;
  Type TVar10;
  double dVar11;
  double dVar12;
  Type TStack_50;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x105,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) goto LAB_009912d4;
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x106,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) goto LAB_009912d4;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x107,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_009912d4;
    *puVar4 = 0;
  }
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_009912d4;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    TVar10 = TypeIds_FirstNumberType;
  }
  else if ((ulong)aLeft >> 0x32 == 0) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_009912d4;
      *puVar4 = 0;
    }
    TVar10 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_009912d4;
      *puVar4 = 0;
    }
  }
  else {
    TVar10 = TypeIds_Number;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_009912d4;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aRight);
  if (bVar2) {
    TStack_50 = TypeIds_FirstNumberType;
  }
  else if ((ulong)aRight >> 0x32 == 0) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_009912d4;
      *puVar4 = 0;
    }
    TStack_50 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TStack_50) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_009912d4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    TStack_50 = TypeIds_Number;
  }
  if (TStack_50 == TVar10) {
    if (TVar10 == TypeIds_FirstNumberType) {
      iVar8 = TaggedInt::ToInt64(aLeft);
      iVar9 = TaggedInt::ToInt64(aRight);
      pvVar6 = JavascriptNumber::ToVar(iVar8 + iVar9,scriptContext);
      return pvVar6;
    }
    if (TVar10 == TypeIds_String) {
      pJVar7 = UnsafeVarTo<Js::JavascriptString>(aLeft);
      pstRight = UnsafeVarTo<Js::JavascriptString>(aRight);
      pJVar7 = JavascriptString::Concat(pJVar7,pstRight);
      return pJVar7;
    }
    if (TVar10 != TypeIds_Number) {
LAB_00991256:
      pvVar6 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,(JavascriptNumber *)0x0,false);
      return pvVar6;
    }
    dVar11 = JavascriptNumber::GetValue(aLeft);
  }
  else {
    if ((TVar10 == TypeIds_Number) && (TStack_50 == TypeIds_FirstNumberType)) {
      dVar12 = JavascriptNumber::GetValue(aLeft);
      dVar12 = dVar12 + (double)(int)aRight;
      goto LAB_0099123f;
    }
    if ((TVar10 != TypeIds_FirstNumberType) || (TStack_50 != TypeIds_Number)) goto LAB_00991256;
    dVar11 = (double)(int)aLeft;
  }
  dVar12 = JavascriptNumber::GetValue(aRight);
  dVar12 = dVar12 + dVar11;
LAB_0099123f:
  pvVar6 = JavascriptNumber::ToVarNoCheck(dVar12,scriptContext);
  return pvVar6;
}

Assistant:

Var JavascriptMath::Add_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Add_Full);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);

            if (typeRight == typeLeft)
            {
                // If both sides are numbers/string, then we can do the addition directly
                if(typeLeft == TypeIds_Number)
                {
                    double sum = JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::ToVarNoCheck(sum, scriptContext);
                }
                else if (typeLeft == TypeIds_Integer)
                {
                    __int64 sum = TaggedInt::ToInt64(aLeft) + TaggedInt::ToInt64(aRight);
                    return JavascriptNumber::ToVar(sum, scriptContext);
                }
                else if (typeLeft == TypeIds_String)
                {
                    return JavascriptString::Concat(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
                }
            }
            else if(typeLeft == TypeIds_Number && typeRight == TypeIds_Integer)
            {
                double sum = JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight);
                return JavascriptNumber::ToVarNoCheck(sum, scriptContext);
            }
            else if(typeLeft == TypeIds_Integer && typeRight == TypeIds_Number)
            {
                double sum = TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight);
                return JavascriptNumber::ToVarNoCheck(sum, scriptContext);
            }

            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, nullptr, false);
            JIT_HELPER_END(Op_Add_Full);
         }